

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  IfGenerateSyntax *pIVar1;
  Token TVar2;
  Token TVar3;
  MemberSyntax *in_stack_00000010;
  ElseClauseSyntax **in_stack_00000018;
  BumpAllocator *in_stack_00000028;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000030;
  BumpAllocator *in_stack_000000c8;
  Token *in_stack_000000d0;
  BumpAllocator *in_stack_ffffffffffffff78;
  MemberSyntax *in_stack_ffffffffffffff80;
  
  deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000030,in_stack_00000028);
  TVar2 = parsing::Token::deepClone(in_stack_000000d0,in_stack_000000c8);
  TVar3 = parsing::Token::deepClone(in_stack_000000d0,in_stack_000000c8);
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0x593faa);
  deepClone<slang::syntax::ExpressionSyntax>
            ((ExpressionSyntax *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  parsing::Token::deepClone(in_stack_000000d0,in_stack_000000c8);
  not_null<slang::syntax::MemberSyntax_*>::operator*
            ((not_null<slang::syntax::MemberSyntax_*> *)0x593ff0);
  deepClone<slang::syntax::MemberSyntax>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  if (((BumpAllocator *)((long)__fn + 0x90))->head != (Segment *)0x0) {
    deepClone<slang::syntax::ElseClauseSyntax>
              ((ElseClauseSyntax *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  pIVar1 = BumpAllocator::
           emplace<slang::syntax::IfGenerateSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::MemberSyntax&,slang::syntax::ElseClauseSyntax*>
                     ((BumpAllocator *)__fn,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)__child_stack,
                      (Token *)TVar2.info,TVar2._0_8_,(ExpressionSyntax *)TVar3.info,TVar3._0_8_,
                      in_stack_00000010,in_stack_00000018);
  return (int)pIVar1;
}

Assistant:

static SyntaxNode* clone(const IfGenerateSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<IfGenerateSyntax>(
        *deepClone(node.attributes, alloc),
        node.keyword.deepClone(alloc),
        node.openParen.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.condition, alloc),
        node.closeParen.deepClone(alloc),
        *deepClone<MemberSyntax>(*node.block, alloc),
        node.elseClause ? deepClone(*node.elseClause, alloc) : nullptr
    );
}